

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_addUnitsMultipleTimes_Test::~Units_addUnitsMultipleTimes_Test
          (Units_addUnitsMultipleTimes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, addUnitsMultipleTimes)
{
    auto model = libcellml::Model::create("model");
    auto units = libcellml::Units::create("units");

    // Add the units once.
    EXPECT_TRUE(model->addUnits(units));
    EXPECT_EQ(size_t(1), model->unitsCount());

    // Try to add the same units a second time. Rejected.
    EXPECT_TRUE(model->addUnits(units));

    // We can't add the same units more than once, hence we still have one
    // units.
    EXPECT_EQ(size_t(2), model->unitsCount());
}